

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_from_python.hpp
# Opt level: O0

void boost::python::converter::shared_ptr_from_python<GlobalStimulationCommand,_std::shared_ptr>::
     construct(PyObject *source,rvalue_from_python_stage1_data *data)

{
  shared_ptr<void> *in_RSI;
  _object *in_RDI;
  shared_ptr<void> hold_convertible_ref_count;
  void *storage;
  borrowed<_object> *in_stack_ffffffffffffffa8;
  shared_ptr<GlobalStimulationCommand> *this;
  shared_ptr<GlobalStimulationCommand> local_38;
  shared_ptr_deleter *in_stack_ffffffffffffffe0;
  shared_ptr<void> *__p;
  
  __p = in_RSI + 1;
  if ((_object *)(in_RSI->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == in_RDI) {
    std::shared_ptr<GlobalStimulationCommand>::shared_ptr
              ((shared_ptr<GlobalStimulationCommand> *)0x3b6045);
  }
  else {
    borrowed<_object>(in_RDI);
    this = &local_38;
    handle<_object>::handle<boost::python::detail::borrowed<_object>>
              ((handle<_object> *)this,in_stack_ffffffffffffffa8);
    shared_ptr_deleter::shared_ptr_deleter
              ((shared_ptr_deleter *)
               &local_38.super___shared_ptr<GlobalStimulationCommand,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,this);
    std::shared_ptr<void>::shared_ptr<void,boost::python::converter::shared_ptr_deleter,void>
              (in_RSI,__p,in_stack_ffffffffffffffe0);
    shared_ptr_deleter::~shared_ptr_deleter
              ((shared_ptr_deleter *)
               &local_38.super___shared_ptr<GlobalStimulationCommand,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    handle<_object>::~handle((handle<_object> *)0x3b60a0);
    std::shared_ptr<GlobalStimulationCommand>::shared_ptr<void>
              (this,(shared_ptr<void> *)in_stack_ffffffffffffffa8,(element_type *)0x3b60b7);
    std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x3b60c1);
  }
  (in_RSI->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = __p;
  return;
}

Assistant:

static void construct(PyObject* source, rvalue_from_python_stage1_data* data)
  {
    void* const storage = ((converter::rvalue_from_python_storage<SP<T> >*)data)->storage.bytes;
    // Deal with the "None" case.
    if (data->convertible == source)
      new (storage) SP<T>();
    else
    {
      SP<void> hold_convertible_ref_count(
	 (void*)0, shared_ptr_deleter(handle<>(borrowed(source))) );
      // use aliasing constructor
      new (storage) SP<T>(hold_convertible_ref_count,
			  static_cast<T*>(data->convertible));
    }

    data->convertible = storage;
  }